

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

double __thiscall pstore::broker::command_processor::log(command_processor *this,double __x)

{
  ulong uVar1;
  char *t;
  undefined8 in_RSI;
  double __x_00;
  double dVar2;
  not_null<const_char_*> local_d8;
  byte local_c9;
  string local_c8 [32];
  _Hash_node<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_false>
  local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hash_node<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_false>
  local_68 [3];
  string local_38 [8];
  string message;
  broker_command *c_local;
  command_processor *this_local;
  
  message.field_2._8_8_ = in_RSI;
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)local_38);
  std::operator+(&local_88,"verb:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 message.field_2._8_8_);
  std::operator+(local_68,(char *)&local_88);
  std::__cxx11::string::operator=(local_38,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&local_88);
  uVar1 = std::__cxx11::string::length();
  local_c9 = 0;
  if (uVar1 < 0x20) {
    std::__cxx11::string::string((string *)local_a8,(string *)(message.field_2._8_8_ + 0x20));
  }
  else {
    std::__cxx11::string::substr((ulong)local_c8,message.field_2._8_8_ + 0x20);
    local_c9 = 1;
    std::operator+(local_a8,(char *)local_c8);
  }
  std::__cxx11::string::operator+=(local_38,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  if ((local_c9 & 1) != 0) {
    std::__cxx11::string::~string(local_c8);
  }
  t = (char *)std::__cxx11::string::c_str();
  pstore::gsl::not_null<const_char_*>::not_null(&local_d8,t);
  pstore::log((pstore *)0x6,__x_00);
  dVar2 = (double)std::__cxx11::string::~string(local_38);
  return dVar2;
}

Assistant:

void command_processor::log (broker_command const & c) const {
            static constexpr char const verb[] = "verb:";
            static constexpr auto verb_length = array_elements (verb) - 1;
            static constexpr char const path[] = " path:";
            static constexpr auto path_length = array_elements (path) - 1;
            static constexpr auto max_path_length = std::size_t{32};
            static constexpr char const ellipsis[] = "...";
            static constexpr auto ellipsis_length = array_elements (ellipsis) - 1;

            std::string message;
            message.reserve (verb_length + c.verb.length () + path_length + max_path_length +
                             ellipsis_length);

            message = verb + c.verb + path;
            message += (c.path.length () < max_path_length)
                           ? c.path
                           : (c.path.substr (0, max_path_length) + ellipsis);
            pstore::log (priority::info, message.c_str ());
        }